

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O0

void __thiscall
entt::basic_registry<entt::entity>::pool_handler<Transform>::pool_handler
          (pool_handler<Transform> *this,pool_handler<Transform> *param_1)

{
  pool_handler<Transform> *param_1_local;
  pool_handler<Transform> *this_local;
  
  storage<entt::entity,_Transform>::storage
            (&this->super_storage<entt::entity,_Transform>,
             &param_1->super_storage<entt::entity,_Transform>);
  (this->super_storage<entt::entity,_Transform>).super_basic_storage<entt::entity,_Transform,_void>.
  super_sparse_set<entt::entity>._vptr_sparse_set = (_func_int **)&PTR__pool_handler_00dfc268;
  this->group = param_1->group;
  sigh<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Transform_&)>::sigh
            (&this->construction,&param_1->construction);
  sigh<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Transform_&)>::sigh
            (&this->update,&param_1->update);
  sigh<void_(entt::entity,_entt::basic_registry<entt::entity>_&)>::sigh
            (&this->destruction,&param_1->destruction);
  return;
}

Assistant:

pool_handler() ENTT_NOEXCEPT = default;